

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

int ImFormatString(char *buf,size_t buf_size,char *fmt,...)

{
  int iVar1;
  char in_AL;
  int iVar2;
  int iVar3;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  bool bVar4;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 local_e8;
  void **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  local_d8 = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_e0 = &args[0].overflow_arg_area;
  local_e8 = 0x3000000018;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  iVar2 = vsnprintf(buf,buf_size,fmt,&local_e8);
  if (buf != (char *)0x0) {
    iVar3 = (int)buf_size + -1;
    iVar1 = iVar3;
    if (iVar2 < (int)buf_size) {
      iVar1 = iVar2;
    }
    bVar4 = iVar2 == -1;
    iVar2 = iVar1;
    if (bVar4) {
      iVar2 = iVar3;
    }
    buf[iVar2] = '\0';
  }
  return iVar2;
}

Assistant:

int ImFormatString(char* buf, size_t buf_size, const char* fmt, ...)
{
    va_list args;
    va_start(args, fmt);
#ifdef IMGUI_USE_STB_SPRINTF
    int w = stbsp_vsnprintf(buf, (int)buf_size, fmt, args);
#else
    int w = vsnprintf(buf, buf_size, fmt, args);
#endif
    va_end(args);
    if (buf == NULL)
        return w;
    if (w == -1 || w >= (int)buf_size)
        w = (int)buf_size - 1;
    buf[w] = 0;
    return w;
}